

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funchook_unix.c
# Opt level: O1

int funchook_page_free(funchook_t *funchook,funchook_page_t *page)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  char errbuf [128];
  char acStack_98 [128];
  
  iVar1 = munmap(page,0x1000);
  if (iVar1 == 0) {
    iVar1 = 0;
    funchook_log(funchook," deallocate page %p (size=%lu)\n",page,0x1000);
  }
  else {
    piVar2 = __errno_location();
    pcVar3 = strerror_r(*piVar2,acStack_98,0x80);
    funchook_set_error_message
              (funchook,"Failed to deallocate page %p (size=%lu, error=%s)",page,0x1000,pcVar3);
    iVar1 = 9;
  }
  return iVar1;
}

Assistant:

int funchook_page_free(funchook_t *funchook, funchook_page_t *page)
{
    char errbuf[128];
    int rv = munmap(page, page_size);

    if (rv == 0) {
        funchook_log(funchook, " deallocate page %p (size=%"PRIuPTR")\n",
                     page, page_size);
        return 0;
    }
    funchook_set_error_message(funchook, "Failed to deallocate page %p (size=%"PRIuPTR", error=%s)",
                               page, page_size,
                               funchook_strerror(errno, errbuf, sizeof(errbuf)));
    return FUNCHOOK_ERROR_MEMORY_FUNCTION;
}